

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void plain_array_suite::remove_back_n(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> input_00;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> input_01;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> input_02;
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  allocator<int> local_3b5;
  int local_3b4;
  iterator local_3b0;
  size_type local_3a8;
  undefined1 local_3a0 [8];
  vector<int,_std::allocator<int>_> expect_7;
  undefined1 auStack_358 [8];
  vector<int,_std::allocator<int>_> expect_6;
  int local_338 [4];
  iterator local_328;
  undefined8 local_320;
  int *local_318;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_310;
  iterator local_308;
  iterator local_2f8;
  allocator<int> local_2e1;
  int local_2e0 [2];
  iterator local_2d8;
  size_type local_2d0;
  undefined1 local_2c8 [8];
  vector<int,_std::allocator<int>_> expect_5;
  allocator<int> local_27d;
  int local_27c;
  iterator local_278;
  size_type local_270;
  undefined1 local_268 [8];
  vector<int,_std::allocator<int>_> expect_4;
  allocator<int> local_1fd;
  int local_1fc [3];
  iterator local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  vector<int,_std::allocator<int>_> expect_3;
  allocator<int> local_191;
  int local_190 [2];
  iterator local_188;
  size_type local_180;
  undefined1 local_178 [8];
  vector<int,_std::allocator<int>_> expect_2;
  allocator<int> local_109;
  int local_108 [4];
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_8d;
  int local_8c [3];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x16;
  input_02._M_len = 4;
  input_02._M_array =
       (iterator)
       &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_02);
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,1);
  local_8c[0] = 0xb;
  local_8c[1] = 0x16;
  local_8c[2] = 0x21;
  local_80 = local_8c;
  local_78 = 3;
  std::allocator<int>::allocator(&local_8d);
  __l_05._M_len = local_78;
  __l_05._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__l_05,&local_8d);
  std::allocator<int>::~allocator(&local_8d);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_70);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_70);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6f4,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  vista::circular_view<int,_18446744073709551615UL>::push_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_108[0] = 0x37;
  local_108[1] = 0xb;
  local_108[2] = 0x16;
  local_108[3] = 0x21;
  local_f8 = local_108;
  local_f0 = 4;
  std::allocator<int>::allocator(&local_109);
  __l_04._M_len = local_f0;
  __l_04._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e8,__l_04,&local_109);
  std::allocator<int>::~allocator(&local_109);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_e8);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_e8)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6fa,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8);
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0xb;
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x16;
  input_01._M_len = 4;
  input_01._M_array =
       (iterator)
       &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_190[0] = 0xb;
  local_190[1] = 0x16;
  local_188 = local_190;
  local_180 = 2;
  std::allocator<int>::allocator(&local_191);
  __l_03._M_len = local_180;
  __l_03._M_array = local_188;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_178,__l_03,&local_191);
  std::allocator<int>::~allocator(&local_191);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_178);
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_178);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x702,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_178);
  vista::circular_view<int,_18446744073709551615UL>::push_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_1fc[0] = 0x37;
  local_1fc[1] = 0xb;
  local_1fc[2] = 0x16;
  local_1f0 = local_1fc;
  local_1e8 = 3;
  std::allocator<int>::allocator(&local_1fd);
  __l_02._M_len = local_1e8;
  __l_02._M_array = local_1f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1e0,__l_02,&local_1fd);
  std::allocator<int>::~allocator(&local_1fd);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_1e0);
  iVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_1e0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x708,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1e0);
  expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0xb;
  expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x16;
  input_00._M_len = 4;
  input_00._M_array =
       (iterator)
       &expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_27c = 0xb;
  local_278 = &local_27c;
  local_270 = 1;
  std::allocator<int>::allocator(&local_27d);
  __l_01._M_len = local_270;
  __l_01._M_array = local_278;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_01,&local_27d);
  std::allocator<int>::~allocator(&local_27d);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_268);
  expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_268);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x710,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_268);
  vista::circular_view<int,_18446744073709551615UL>::push_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_2e0[0] = 0x37;
  local_2e0[1] = 0xb;
  local_2d8 = local_2e0;
  local_2d0 = 2;
  std::allocator<int>::allocator(&local_2e1);
  __l_00._M_len = local_2d0;
  __l_00._M_array = local_2d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_2c8,__l_00,&local_2e1);
  std::allocator<int>::~allocator(&local_2e1);
  local_2f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_308 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_310._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_2c8);
  local_318 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_2c8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x716,"void plain_array_suite::remove_back_n()",local_2f8,local_308,local_310,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_318);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_2c8);
  local_338[0] = 0xb;
  local_338[1] = 0x16;
  local_338[2] = 0x21;
  local_338[3] = 0x2c;
  local_328 = local_338;
  local_320 = 4;
  input._M_len = 4;
  input._M_array = local_328;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,4);
  auStack_358 = (undefined1  [8])0x0;
  expect_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_358);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_358);
  expect_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_358);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x71e,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_358);
  vista::circular_view<int,_18446744073709551615UL>::push_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_3b4 = 0x37;
  local_3b0 = &local_3b4;
  local_3a8 = 1;
  std::allocator<int>::allocator(&local_3b5);
  __l._M_len = local_3a8;
  __l._M_array = local_3b0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3a0,__l,&local_3b5);
  std::allocator<int>::~allocator(&local_3b5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_3a0);
  iVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_3a0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x724,"void plain_array_suite::remove_back_n()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_3a0);
  return;
}

Assistant:

void remove_back_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    span.remove_back(1);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }

    span = { 11, 22, 33, 44 };
    span.remove_back(2);
    {
        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }

    span = { 11, 22, 33, 44 };
    span.remove_back(3);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }

    span = { 11, 22, 33, 44 };
    span.remove_back(4);
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(55);
    {
        std::vector<int> expect = { 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}